

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigInfo.cpp
# Opt level: O1

deInt32 __thiscall eglu::ConfigInfo::getAttribute(ConfigInfo *this,deUint32 attribute)

{
  InternalError *this_00;
  
  if ((int)attribute < 0x330a) {
    switch(attribute) {
    case 0x3020:
      break;
    case 0x3021:
      this = (ConfigInfo *)&this->alphaSize;
      break;
    case 0x3022:
      this = (ConfigInfo *)&this->blueSize;
      break;
    case 0x3023:
      this = (ConfigInfo *)&this->greenSize;
      break;
    case 0x3024:
      this = (ConfigInfo *)&this->redSize;
      break;
    case 0x3025:
      this = (ConfigInfo *)&this->depthSize;
      break;
    case 0x3026:
      this = (ConfigInfo *)&this->stencilSize;
      break;
    case 0x3027:
      this = (ConfigInfo *)&this->configCaveat;
      break;
    case 0x3028:
      this = (ConfigInfo *)&this->configId;
      break;
    case 0x3029:
      this = (ConfigInfo *)&this->level;
      break;
    case 0x302a:
      this = (ConfigInfo *)&this->maxPbufferHeight;
      break;
    case 0x302b:
    case 0x3030:
    case 0x3038:
    case 0x3041:
switchD_00e9b3b5_caseD_302b:
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,"Unknown attribute",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluConfigInfo.cpp"
                 ,0x53);
      __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    case 0x302c:
      this = (ConfigInfo *)&this->maxPbufferWidth;
      break;
    case 0x302d:
      this = (ConfigInfo *)&this->nativeRenderable;
      break;
    case 0x302e:
      this = (ConfigInfo *)&this->nativeVisualId;
      break;
    case 0x302f:
      this = (ConfigInfo *)&this->nativeVisualType;
      break;
    case 0x3031:
      this = (ConfigInfo *)&this->samples;
      break;
    case 0x3032:
      this = (ConfigInfo *)&this->sampleBuffers;
      break;
    case 0x3033:
      this = (ConfigInfo *)&this->surfaceType;
      break;
    case 0x3034:
      this = (ConfigInfo *)&this->transparentType;
      break;
    case 0x3035:
      this = (ConfigInfo *)&this->transparentBlueValue;
      break;
    case 0x3036:
      this = (ConfigInfo *)&this->transparentGreenValue;
      break;
    case 0x3037:
      this = (ConfigInfo *)&this->transparentRedValue;
      break;
    case 0x3039:
      this = (ConfigInfo *)&this->bindToTextureRGB;
      break;
    case 0x303a:
      this = (ConfigInfo *)&this->bindToTextureRGBA;
      break;
    case 0x303b:
      this = (ConfigInfo *)&this->minSwapInterval;
      break;
    case 0x303c:
      this = (ConfigInfo *)&this->maxSwapInterval;
      break;
    case 0x303d:
      this = (ConfigInfo *)&this->luminanceSize;
      break;
    case 0x303e:
      this = (ConfigInfo *)&this->alphaMaskSize;
      break;
    case 0x303f:
      this = (ConfigInfo *)&this->colorBufferType;
      break;
    case 0x3040:
      this = (ConfigInfo *)&this->renderableType;
      break;
    case 0x3042:
      this = (ConfigInfo *)&this->conformant;
      break;
    default:
      if (attribute != 0x3301) goto switchD_00e9b3b5_caseD_302b;
      this = (ConfigInfo *)&this->yuvOrder;
    }
  }
  else {
    switch(attribute) {
    case 0x3311:
      this = (ConfigInfo *)&this->yuvNumberOfPlanes;
      break;
    case 0x3312:
      this = (ConfigInfo *)&this->yuvSubsample;
      break;
    case 0x3313:
    case 0x3314:
    case 0x3315:
    case 0x3316:
    case 0x3318:
    case 0x3319:
      goto switchD_00e9b3b5_caseD_302b;
    case 0x3317:
      this = (ConfigInfo *)&this->yuvDepthRange;
      break;
    case 0x331a:
      this = (ConfigInfo *)&this->yuvPlaneBpp;
      break;
    default:
      if (attribute == 0x330a) {
        this = (ConfigInfo *)&this->yuvCscStandard;
      }
      else {
        if (attribute != 0x3339) goto switchD_00e9b3b5_caseD_302b;
        this = (ConfigInfo *)&this->colorComponentType;
      }
    }
  }
  return this->bufferSize;
}

Assistant:

deInt32 ConfigInfo::getAttribute (deUint32 attribute) const
{
	switch (attribute)
	{
		case EGL_BUFFER_SIZE:				return bufferSize;
		case EGL_RED_SIZE:					return redSize;
		case EGL_GREEN_SIZE:				return greenSize;
		case EGL_BLUE_SIZE:					return blueSize;
		case EGL_LUMINANCE_SIZE:			return luminanceSize;
		case EGL_ALPHA_SIZE:				return alphaSize;
		case EGL_ALPHA_MASK_SIZE:			return alphaMaskSize;
		case EGL_BIND_TO_TEXTURE_RGB:		return bindToTextureRGB;
		case EGL_BIND_TO_TEXTURE_RGBA:		return bindToTextureRGBA;
		case EGL_COLOR_BUFFER_TYPE:			return colorBufferType;
		case EGL_CONFIG_CAVEAT:				return configCaveat;
		case EGL_CONFIG_ID:					return configId;
		case EGL_CONFORMANT:				return conformant;
		case EGL_DEPTH_SIZE:				return depthSize;
		case EGL_LEVEL:						return level;
		case EGL_MAX_PBUFFER_WIDTH:			return maxPbufferWidth;
		case EGL_MAX_PBUFFER_HEIGHT:		return maxPbufferHeight;
		case EGL_MAX_SWAP_INTERVAL:			return maxSwapInterval;
		case EGL_MIN_SWAP_INTERVAL:			return minSwapInterval;
		case EGL_NATIVE_RENDERABLE:			return nativeRenderable;
		case EGL_NATIVE_VISUAL_ID:			return nativeVisualId;
		case EGL_NATIVE_VISUAL_TYPE:		return nativeVisualType;
		case EGL_RENDERABLE_TYPE:			return renderableType;
		case EGL_SAMPLE_BUFFERS:			return sampleBuffers;
		case EGL_SAMPLES:					return samples;
		case EGL_STENCIL_SIZE:				return stencilSize;
		case EGL_SURFACE_TYPE:				return surfaceType;
		case EGL_TRANSPARENT_TYPE:			return transparentType;
		case EGL_TRANSPARENT_RED_VALUE:		return transparentRedValue;
		case EGL_TRANSPARENT_GREEN_VALUE:	return transparentGreenValue;
		case EGL_TRANSPARENT_BLUE_VALUE:	return transparentBlueValue;

		// EGL_EXT_yuv_surface
		case EGL_YUV_ORDER_EXT:				return yuvOrder;
		case EGL_YUV_NUMBER_OF_PLANES_EXT:	return yuvNumberOfPlanes;
		case EGL_YUV_SUBSAMPLE_EXT:			return yuvSubsample;
		case EGL_YUV_DEPTH_RANGE_EXT:		return yuvDepthRange;
		case EGL_YUV_CSC_STANDARD_EXT:		return yuvCscStandard;
		case EGL_YUV_PLANE_BPP_EXT:			return yuvPlaneBpp;

		// EGL_EXT_pixel_format_float
		case EGL_COLOR_COMPONENT_TYPE_EXT:	return colorComponentType;

		default:							TCU_THROW(InternalError, "Unknown attribute");
	}
}